

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O3

int sortforremap2(void *a,void *b)

{
  int iVar1;
  
  iVar1 = *a - *b;
  if (iVar1 == 0) {
    iVar1 = (uint)*(byte *)((long)b + 4) - (uint)*(byte *)((long)a + 4);
  }
  return iVar1;
}

Assistant:

static int sortforremap2 (const void *a, const void *b)
{
	const RemappingWork *ap = (const RemappingWork *)a;
	const RemappingWork *bp = (const RemappingWork *)b;

	if (ap->Color == bp->Color)
	{
		return bp->Foreign - ap->Foreign;
	}
	else
	{
		return ap->Color - bp->Color;
	}
}